

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O2

bool __thiscall AddressFilter::IsInList(AddressFilter *this,uint8_t *addr,size_t len)

{
  IPAsKey *pIVar1;
  size_t __n;
  IPAsKey key;
  
  key._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001b4520;
  key.HashNext = (IPAsKey *)0x0;
  key.count = 1;
  key.hash = 0;
  __n = 0x10;
  if (len < 0x10) {
    __n = len;
  }
  memcpy(key.addr,addr,__n);
  key.addr_len = __n;
  pIVar1 = BinHash<IPAsKey>::Retrieve(&this->table,&key);
  return pIVar1 != (IPAsKey *)0x0;
}

Assistant:

bool AddressFilter::IsInList(uint8_t * addr, size_t len)
{
    IPAsKey key(addr, len);
    IPAsKey * ret = table.Retrieve(&key);

    return (ret != NULL);
}